

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fullscreen.c
# Opt level: O0

int main(void)

{
  _Bool _Var1;
  uint uVar2;
  mfb_window *window_00;
  uint unaff_retaddr;
  uint unaff_retaddr_00;
  mfb_update_state state;
  int i;
  mfb_window *window;
  int seed;
  int carry;
  int noise;
  mfb_window *in_stack_000000b8;
  uint in_stack_0000017c;
  uint in_stack_00000180;
  uint in_stack_00000184;
  char *in_stack_00000188;
  mfb_update_state in_stack_ffffffffffffffe0;
  int iVar3;
  uint local_10;
  
  local_10 = 0xbeef;
  window_00 = mfb_open_ex(in_stack_00000188,in_stack_00000184,in_stack_00000180,in_stack_0000017c);
  if (window_00 != (mfb_window *)0x0) {
    mfb_set_viewport_best_fit(_state,unaff_retaddr_00,unaff_retaddr);
    do {
      if ((g_active & 1U) == 0) {
        in_stack_ffffffffffffffe0 = mfb_update_events(window_00);
      }
      else {
        for (iVar3 = 0; iVar3 < 0x96000; iVar3 = iVar3 + 1) {
          uVar2 = local_10 ^ (int)local_10 >> 3;
          local_10 = (uVar2 & 1) << 0x1e | (int)local_10 >> 1;
          uVar2 = (int)uVar2 >> 1 & 0xff;
          g_buffer[iVar3] = uVar2 << 0x10 | uVar2 << 8 | uVar2;
        }
        in_stack_ffffffffffffffe0 =
             mfb_update(window_00,(void *)CONCAT44(iVar3,in_stack_ffffffffffffffe0));
      }
    } while ((in_stack_ffffffffffffffe0 == STATE_OK) &&
            (_Var1 = mfb_wait_sync(in_stack_000000b8), _Var1));
  }
  return 0;
}

Assistant:

int
main()
{
    int noise, carry, seed = 0xbeef;

    struct mfb_window *window = mfb_open_ex("full screen auto", WIDTH, HEIGHT, WF_FULLSCREEN);
    if (!window)
        return 0;

    mfb_set_viewport_best_fit(window, WIDTH, HEIGHT);

    do {
        int              i;
        mfb_update_state state;

        if(g_active)
        {
            for (i = 0; i < WIDTH * HEIGHT; ++i)
            {
                noise = seed;
                noise >>= 3;
                noise ^= seed;
                carry = noise & 1;
                noise >>= 1;
                seed >>= 1;
                seed |= (carry << 30);
                noise &= 0xFF;
                g_buffer[i] = MFB_RGB(noise, noise, noise);
            }

            state = mfb_update(window, g_buffer);
        }
        else {
            state = mfb_update_events(window);
        }
        if (state != STATE_OK) {
            window = 0x0;
            break;
        }
    } while(mfb_wait_sync(window));

    return 0;
}